

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sink.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::CodeSinkingPass::IsSyncOnUniform(CodeSinkingPass *this,uint32_t mem_semantics_id)

{
  int iVar1;
  uint32_t uVar2;
  ConstantManager *this_00;
  Constant *this_01;
  undefined4 extraout_var;
  
  this_00 = IRContext::get_constant_mgr((this->super_Pass).context_);
  this_01 = analysis::ConstantManager::FindDeclaredConstant(this_00,mem_semantics_id);
  if (this_01 == (Constant *)0x0) {
    __assert_fail("mem_semantics_const != nullptr && \"Expecting memory semantics id to be a constant.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/code_sink.cpp"
                  ,0x100,"bool spvtools::opt::CodeSinkingPass::IsSyncOnUniform(uint32_t) const");
  }
  iVar1 = (*this_01->_vptr_Constant[0xe])(this_01);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    uVar2 = analysis::Constant::GetU32(this_01);
    return (bool)((uVar2 & 0xe) != 0 & (byte)uVar2 >> 6);
  }
  __assert_fail("mem_semantics_const->AsIntConstant() && \"Memory semantics should be an integer.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/code_sink.cpp"
                ,0x102,"bool spvtools::opt::CodeSinkingPass::IsSyncOnUniform(uint32_t) const");
}

Assistant:

bool CodeSinkingPass::IsSyncOnUniform(uint32_t mem_semantics_id) const {
  const analysis::Constant* mem_semantics_const =
      context()->get_constant_mgr()->FindDeclaredConstant(mem_semantics_id);
  assert(mem_semantics_const != nullptr &&
         "Expecting memory semantics id to be a constant.");
  assert(mem_semantics_const->AsIntConstant() &&
         "Memory semantics should be an integer.");
  uint32_t mem_semantics_int = mem_semantics_const->GetU32();

  // If it does not affect uniform memory, then it is does not apply to uniform
  // memory.
  if ((mem_semantics_int & uint32_t(spv::MemorySemanticsMask::UniformMemory)) ==
      0) {
    return false;
  }

  // Check if there is an acquire or release.  If so not, this it does not add
  // any memory constraints.
  return (mem_semantics_int &
          uint32_t(spv::MemorySemanticsMask::Acquire |
                   spv::MemorySemanticsMask::AcquireRelease |
                   spv::MemorySemanticsMask::Release)) != 0;
}